

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_VirtualFileToDiskFile_Test::
DiskSourceTreeTest_VirtualFileToDiskFile_Test(DiskSourceTreeTest_VirtualFileToDiskFile_Test *this)

{
  DiskSourceTreeTest_VirtualFileToDiskFile_Test *this_local;
  
  DiskSourceTreeTest::DiskSourceTreeTest(&this->super_DiskSourceTreeTest);
  (this->super_DiskSourceTreeTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskSourceTreeTest_VirtualFileToDiskFile_Test_02a080f8;
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, VirtualFileToDiskFile) {
  // Test VirtualFileToDiskFile.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddFile(absl::StrCat(dirnames_[1], "/foo"), "This file should be hidden.");
  AddFile(absl::StrCat(dirnames_[1], "/quux"),
          "This file should not be hidden.");
  source_tree_.MapPath("bar", dirnames_[0]);
  source_tree_.MapPath("bar", dirnames_[1]);

  // Existent files, shadowed and non-shadowed case.
  std::string disk_file;
  EXPECT_TRUE(source_tree_.VirtualFileToDiskFile("bar/foo", &disk_file));
  EXPECT_EQ(absl::StrCat(dirnames_[0], "/foo"), disk_file);
  EXPECT_TRUE(source_tree_.VirtualFileToDiskFile("bar/quux", &disk_file));
  EXPECT_EQ(absl::StrCat(dirnames_[1], "/quux"), disk_file);

  // Nonexistent file in existent directory and vice versa.
  std::string not_touched = "not touched";
  EXPECT_FALSE(source_tree_.VirtualFileToDiskFile("bar/baz", &not_touched));
  EXPECT_EQ("not touched", not_touched);
  EXPECT_FALSE(source_tree_.VirtualFileToDiskFile("baz/foo", &not_touched));
  EXPECT_EQ("not touched", not_touched);

  // Accept NULL as output parameter.
  EXPECT_TRUE(source_tree_.VirtualFileToDiskFile("bar/foo", nullptr));
  EXPECT_FALSE(source_tree_.VirtualFileToDiskFile("baz/foo", nullptr));
}